

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

void __thiscall Saturation::ConsequenceFinder::onClauseInserted(ConsequenceFinder *this,Clause *cl)

{
  uint indexNum;
  bool *pbVar1;
  Literal **ppLVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = *(uint *)&cl->field_0x38 & 0xfffff;
  uVar3 = (uint)(uVar4 != 0);
  ppLVar2 = (Literal **)0x0;
  if (uVar4 != 0) {
    ppLVar2 = cl->_literals;
  }
  while (ppLVar2 != (Literal **)0x0) {
    indexNum = ((*ppLVar2)->super_Term)._functor;
    if (((*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) + (ulong)indexNum * 8) + 0x40) & 0x20)
         != 0) &&
       (pbVar1 = Lib::Array<bool>::operator[](&(this->_redundant).super_Array<bool>,(ulong)indexNum)
       , *pbVar1 == false)) {
      indexClause(this,indexNum,cl,true);
    }
    ppLVar2 = cl->_literals + (int)uVar3;
    if (uVar4 <= uVar3) {
      ppLVar2 = (Literal **)0x0;
    }
    uVar3 = uVar3 + (uVar3 < uVar4);
  }
  return;
}

Assistant:

void ConsequenceFinder::onClauseInserted(Clause* cl)
{
  TIME_TRACE(TimeTrace::CONSEQUENCE_FINDING);

  bool red=false;
  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(_redundant[fn]) {
      red=true;
    }
    else {
      indexClause(fn, cl, true);
    }
  }
  if(red) {
    //the clause is already redundant, so we should delete it

    //it may not be the right moment to call this function, so in
    //case of problems just comment this out (it will lead just to
    //some extra work of the algorithm).
    //_sa->removeActiveOrPassiveClause(cl);
  }

}